

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Own<kj::DatagramReceiver> __thiscall
kj::anon_unknown_30::DatagramPortImpl::makeReceiver(DatagramPortImpl *this,Capacity capacity)

{
  DatagramReceiver *extraout_RDX;
  Own<kj::DatagramReceiver> OVar1;
  Own<kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl> local_38;
  DatagramPortImpl *local_28;
  DatagramPortImpl *this_local;
  Capacity capacity_local;
  
  this_local = (DatagramPortImpl *)capacity.ancillary;
  local_28 = (DatagramPortImpl *)capacity.content;
  capacity_local.ancillary = (size_t)this;
  heap<kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl,kj::(anonymous_namespace)::DatagramPortImpl&,kj::DatagramReceiver::Capacity&>
            ((kj *)&local_38,local_28,(Capacity *)&this_local);
  Own<kj::DatagramReceiver>::Own<kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl,void>
            ((Own<kj::DatagramReceiver> *)this,&local_38);
  Own<kj::(anonymous_namespace)::DatagramPortImpl::ReceiverImpl>::~Own(&local_38);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<DatagramReceiver> DatagramPortImpl::makeReceiver(DatagramReceiver::Capacity capacity) {
  return kj::heap<ReceiverImpl>(*this, capacity);
}